

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find(StringPiece *this,char c,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  void *pvVar4;
  
  uVar1 = this->length_;
  uVar3 = 0xffffffffffffffff;
  if ((pos <= uVar1 && uVar1 - pos != 0) && 0 < (long)uVar1) {
    pcVar2 = this->ptr_;
    pvVar4 = memchr(pcVar2 + pos,(int)c,uVar1 - pos);
    uVar3 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)pcVar2;
  }
  return uVar3;
}

Assistant:

stringpiece_ssize_type StringPiece::find(char c, size_type pos) const {
  if (length_ <= 0 || pos >= static_cast<size_type>(length_)) {
    return npos;
  }
  const char* result = static_cast<const char*>(
      memchr(ptr_ + pos, c, length_ - pos));
  return result != NULL ? result - ptr_ : npos;
}